

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

int Abc_ObjLevelNew(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  float fVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int Level;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = Abc_ObjFanin(pObj,local_1c);
    iVar1 = Abc_ObjLevel(pObj_00);
    fVar2 = Abc_MaxFloat((float)local_20,(float)iVar1);
    local_20 = (int)fVar2;
  }
  iVar1 = Abc_ObjFaninNum(pObj);
  return local_20 + (uint)(0 < iVar1);
}

Assistant:

int Abc_ObjLevelNew( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Level = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxFloat( Level, Abc_ObjLevel(pFanin) );
    return Level + (int)(Abc_ObjFaninNum(pObj) > 0);
}